

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

void __thiscall Imf_3_4::Context::Context(void *param_1,char *param_2,undefined8 param_3)

{
  element_type *pp_Var1;
  ostream *poVar2;
  ArgExc *this;
  InputExc *this_00;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  exr_result_t rv;
  Context *in_stack_fffffffffffffc80;
  stringstream local_348 [16];
  ostream local_338 [376];
  stringstream local_1c0 [16];
  ostream local_1b0 [396];
  int local_24;
  undefined8 local_20;
  char *local_18;
  void *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  Context(in_stack_fffffffffffffc80);
  pp_Var1 = std::__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  local_24 = exr_start_read(pp_Var1,local_18,local_20);
  if (local_24 == 0) {
    return;
  }
  if (local_24 == 0xd) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar2 = std::operator<<(local_1b0,"Invalid or missing attribute when attempting to open \'");
    poVar2 = std::operator<<(poVar2,local_18);
    std::operator<<(poVar2,"\' for read");
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this,local_1c0);
    __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_348);
  poVar2 = std::operator<<(local_338,"Unable to open \'");
  poVar2 = std::operator<<(poVar2,local_18);
  std::operator<<(poVar2,"\' for read");
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,local_348);
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

Context::Context (const char* filename, const ContextInitializer& ctxtinit, read_mode_t)
    : Context()
{
    exr_result_t rv;

    rv = exr_start_read (_ctxt.get (), filename, &(ctxtinit._initializer));
    if (EXR_ERR_SUCCESS != rv)
    {
        if (rv == EXR_ERR_MISSING_REQ_ATTR)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Invalid or missing attribute when attempting to open '"
                << filename << "' for read");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Unable to open '" << filename << "' for read");
        }
    }
}